

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::SerialArena::AllocateNewBlock(SerialArena *this,size_t n)

{
  bool bVar1;
  ArenaBlock *this_00;
  char *pcVar2;
  char *pcVar3;
  AllocationPolicy *policy_ptr;
  ThreadSafeArenaStats *pTVar4;
  char *pcVar5;
  SizedPtr SVar6;
  ArenaBlock *new_head;
  SizedPtr mem;
  ArenaBlock *old_head;
  size_t wasted;
  size_t used;
  size_t n_local;
  SerialArena *this_local;
  
  wasted = 0;
  old_head = (ArenaBlock *)0x0;
  this_00 = head(this);
  bVar1 = ArenaBlock::IsSentry(this_00);
  if (!bVar1) {
    pcVar2 = ptr(this);
    pcVar3 = ArenaBlock::Pointer(this_00,0x10);
    wasted = (long)pcVar2 - (long)pcVar3;
    old_head = (ArenaBlock *)((this_00->size - wasted) + -0x10);
    AddSpaceUsed(this,wasted);
  }
  policy_ptr = ThreadSafeArena::AllocPolicy(this->parent_);
  SVar6 = anon_unknown_12::AllocateBlock(policy_ptr,this_00->size,n);
  mem.p = (void *)SVar6.n;
  AddSpaceAllocated(this,(size_t)mem.p);
  pTVar4 = ThreadSafeArenaStatsHandle::MutableStats
                     ((ThreadSafeArenaStatsHandle *)&this->parent_->field_0x10);
  ThreadSafeArenaStats::RecordAllocateStats(pTVar4,wasted,(size_t)mem.p,(size_t)old_head);
  new_head = (ArenaBlock *)SVar6.p;
  ArenaBlock::ArenaBlock(new_head,this_00,(size_t)mem.p);
  pcVar2 = ArenaBlock::Pointer(new_head,0x10);
  pcVar3 = ArenaBlock::Limit(new_head);
  set_ptr(this,pcVar2);
  this->prefetch_ptr_ = pcVar2;
  this->limit_ = pcVar3;
  std::atomic<google::protobuf::internal::ArenaBlock_*>::store
            (&this->head_,new_head,memory_order_release);
  pcVar3 = ptr(this);
  pcVar2 = this->limit_;
  pcVar5 = ptr(this);
  PoisonMemoryRegion(pcVar3,(long)pcVar2 - (long)pcVar5);
  return;
}

Assistant:

void SerialArena::AllocateNewBlock(size_t n) {
  size_t used = 0;
  size_t wasted = 0;
  ArenaBlock* old_head = head();
  if (!old_head->IsSentry()) {
    // Record how much used in this block.
    used = static_cast<size_t>(ptr() - old_head->Pointer(kBlockHeaderSize));
    wasted = old_head->size - used - kBlockHeaderSize;
    AddSpaceUsed(used);
  }

  // TODO: Evaluate if pushing unused space into the cached blocks is a
  // win. In preliminary testing showed increased memory savings as expected,
  // but with a CPU regression. The regression might have been an artifact of
  // the microbenchmark.

  auto mem = AllocateBlock(parent_.AllocPolicy(), old_head->size, n);
  AddSpaceAllocated(mem.n);
  ThreadSafeArenaStats::RecordAllocateStats(parent_.arena_stats_.MutableStats(),
                                            /*used=*/used,
                                            /*allocated=*/mem.n, wasted);
  auto* new_head = new (mem.p) ArenaBlock{old_head, mem.n};
  set_range(new_head->Pointer(kBlockHeaderSize), new_head->Limit());
  // Previous writes must take effect before writing new head.
  head_.store(new_head, std::memory_order_release);

  internal::PoisonMemoryRegion(ptr(), limit_ - ptr());
}